

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualMemory.cpp
# Opt level: O0

void __thiscall
xmrig::VirtualMemory::VirtualMemory
          (VirtualMemory *this,size_t size,bool hugePages,bool usePool,uint32_t node,
          size_t alignSize)

{
  byte bVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  size_t sVar5;
  bitset<3UL> *this_00;
  byte in_CL;
  byte in_DL;
  size_t in_RSI;
  size_t *in_RDI;
  undefined4 in_R8D;
  ulong in_R9;
  lock_guard<std::mutex> lock;
  VirtualMemory *in_stack_ffffffffffffff78;
  lock_guard<std::mutex> *in_stack_ffffffffffffff80;
  undefined1 __val;
  undefined7 in_stack_ffffffffffffff88;
  void *local_20;
  size_t local_18;
  size_t local_10;
  void *local_8;
  
  sVar5 = align(in_RSI,0x200000);
  *in_RDI = sVar5;
  *(undefined4 *)(in_RDI + 1) = in_R8D;
  std::bitset<3UL>::bitset((bitset<3UL> *)0x2745fd);
  in_RDI[3] = 0;
  if ((in_CL & 1) != 0) {
    std::lock_guard<std::mutex>::lock_guard
              (in_stack_ffffffffffffff80,(mutex_type *)in_stack_ffffffffffffff78);
    if ((((in_DL & 1) == 0) || (bVar1 = (**(code **)(*pool + 0x10))(pool,in_R8D), (bVar1 & 1) != 0))
       || (bVar2 = allocateLargePagesMemory(in_stack_ffffffffffffff78), !bVar2)) {
      this_00 = (bitset<3UL> *)(**(code **)(*pool + 0x18))(pool,*in_RDI,in_R8D);
      in_RDI[3] = (size_t)this_00;
      if (in_RDI[3] == 0) {
        bVar2 = false;
      }
      else {
        __val = (undefined1)((ulong)(in_RDI + 2) >> 0x38);
        uVar3 = (**(code **)(*pool + 0x10))(pool,in_R8D);
        std::bitset<3UL>::set(this_00,CONCAT17(uVar3,in_stack_ffffffffffffff88),(bool)__val);
        std::bitset<3UL>::set(this_00,CONCAT17(uVar3,in_stack_ffffffffffffff88),(bool)__val);
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x274745);
    if (bVar2) {
      return;
    }
  }
  if (((in_DL & 1) == 0) || (bVar2 = allocateLargePagesMemory(in_stack_ffffffffffffff78), !bVar2)) {
    local_10 = *in_RDI;
    if (in_R9 == 1) {
      local_8 = malloc(local_10);
    }
    else {
      local_18 = in_R9;
      if (((in_R9 & in_R9 - 1) == 0) && (in_R9 < 8)) {
        local_18 = 8;
      }
      iVar4 = posix_memalign(&local_20,local_18,local_10);
      if (iVar4 == 0) {
        local_8 = local_20;
      }
      else {
        local_8 = (void *)0x0;
      }
    }
    in_RDI[3] = (size_t)local_8;
  }
  return;
}

Assistant:

xmrig::VirtualMemory::VirtualMemory(size_t size, bool hugePages, bool usePool, uint32_t node, size_t alignSize) :
    m_size(align(size)),
    m_node(node)
{
    if (usePool) {
        std::lock_guard<std::mutex> lock(mutex);
        if (hugePages && !pool->isHugePages(node) && allocateLargePagesMemory()) {
            return;
        }

        m_scratchpad = pool->get(m_size, node);
        if (m_scratchpad) {
            m_flags.set(FLAG_HUGEPAGES, pool->isHugePages(node));
            m_flags.set(FLAG_EXTERNAL,  true);

            return;
        }
    }

    if (hugePages && allocateLargePagesMemory()) {
        return;
    }

    m_scratchpad = static_cast<uint8_t*>(_mm_malloc(m_size, alignSize));
}